

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setEnterBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  pointer pnVar4;
  double *pdVar5;
  cpp_dec_float<50U,_int,_void> local_58;
  
  SVar2 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.rowstat.data[n];
  if (SVar2 == P_FIXED) {
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_58,-*pdVar5,(type *)0x0);
    pnVar4 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar4[i].m_backend.data + 0x20) = local_58.data._M_elems._32_8_;
    puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_58.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_58.data._M_elems._24_8_;
    pnVar3 = pnVar4 + i;
    (pnVar3->m_backend).data._M_elems[0] = local_58.data._M_elems[0];
    *(uint *)((long)&(pnVar3->m_backend).data + 4) = local_58.data._M_elems[1];
    *(uint *)((long)&(pnVar3->m_backend).data + 8) = local_58.data._M_elems[2];
    *(uint *)((long)&(pnVar3->m_backend).data + 0xc) = local_58.data._M_elems[3];
    pnVar4[i].m_backend.exp = local_58.exp;
    pnVar4[i].m_backend.neg = local_58.neg;
    pnVar4[i].m_backend.fpclass = local_58.fpclass;
    pnVar4[i].m_backend.prec_elem = local_58.prec_elem;
  }
  else {
    if (SVar2 != P_ON_UPPER) {
      if (SVar2 == P_ON_LOWER) {
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_58,-*pdVar5,(type *)0x0);
        pnVar3 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar3[i].m_backend.data + 0x20) = local_58.data._M_elems._32_8_;
        puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_58.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_58.data._M_elems._24_8_;
        *(ulong *)&pnVar3[i].m_backend.data =
             CONCAT44(local_58.data._M_elems[1],local_58.data._M_elems[0]);
        *(ulong *)((long)&pnVar3[i].m_backend.data + 8) =
             CONCAT44(local_58.data._M_elems[3],local_58.data._M_elems[2]);
        pnVar3[i].m_backend.exp = local_58.exp;
        pnVar3[i].m_backend.neg = local_58.neg;
        pnVar3[i].m_backend.fpclass = local_58.fpclass;
        pnVar3[i].m_backend.prec_elem = local_58.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                   &(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
        return;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(this->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
      return;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&(this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
  }
  pdVar5 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_58,*pdVar5,(type *)0x0);
  pnVar3 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)(pnVar3 + i) + 0x20) = local_58.data._M_elems._32_8_;
  *(undefined8 *)((long)(pnVar3 + i) + 0x10) = local_58.data._M_elems._16_8_;
  *(undefined8 *)((long)(pnVar3 + i) + 0x18) = local_58.data._M_elems._24_8_;
  *(ulong *)(pnVar3 + i) = CONCAT44(local_58.data._M_elems[1],local_58.data._M_elems[0]);
  *(ulong *)((long)(pnVar3 + i) + 8) = CONCAT44(local_58.data._M_elems[3],local_58.data._M_elems[2])
  ;
  *(int *)((long)(pnVar3 + i) + 0x28) = local_58.exp;
  *(bool *)((long)(pnVar3 + i) + 0x2c) = local_58.neg;
  *(undefined8 *)((long)(pnVar3 + i) + 0x30) = local_58._48_8_;
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}